

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double normal_truncated_b_pdf(double x,double mu,double s,double b)

{
  double dVar1;
  double dVar2;
  double xi_pdf;
  double xi;
  double pdf;
  double beta_cdf;
  double beta;
  double b_local;
  double s_local;
  double mu_local;
  double x_local;
  
  dVar1 = normal_01_cdf((b - mu) / s);
  dVar2 = normal_01_pdf((x - mu) / s);
  return (dVar2 / dVar1) / s;
}

Assistant:

double normal_truncated_b_pdf ( double x, double mu, double s, double b )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_B_PDF evaluates the upper truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    21 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double B, the upper truncation limit.
//
//    Output, double NORMAL_TRUNCATED_B_PDF, the value of the PDF.
//
{
  double beta;
  double beta_cdf;
  double pdf;
  double xi;
  double xi_pdf;

  beta = ( b - mu ) / s;
  xi = ( x - mu ) / s;

  beta_cdf = normal_01_cdf ( beta );
  xi_pdf = normal_01_pdf ( xi );

  pdf = xi_pdf / beta_cdf / s;

  return pdf;
}